

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O2

void * dlsym_wrapper(void *handle,char *symbol_name)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  code *pcVar6;
  code *pcVar7;
  void *pvVar8;
  void **ppvVar9;
  long lVar10;
  undefined8 uVar11;
  char *pcVar12;
  link_map *lib;
  internal_binding_t *binding;
  code *local_60;
  code *local_58;
  void *local_50;
  undefined1 local_48 [8];
  link_map *local_40;
  undefined8 local_38;
  
  pcVar6 = (code *)gotcha_get_wrappee(orig_dlopen_handle);
  pcVar7 = (code *)gotcha_get_wrappee(orig_dlsym_handle);
  pFVar2 = _stderr;
  binding = (internal_binding_t *)0x0;
  local_58 = pcVar7;
  if (0 < debug_level) {
    uVar4 = gotcha_gettid();
    uVar5 = getpid();
    pcVar7 = local_58;
    fprintf(pFVar2,"[%d/%d][%s:%u] - User called dlsym(%p, %s)\n",(ulong)uVar4,(ulong)uVar5,
            "gotcha_dl.c",0xa0,handle,symbol_name);
  }
  iVar3 = lookup_hashtable(&function_hash_table,symbol_name,&binding);
  pvVar8 = (void *)(*pcVar7)(handle,symbol_name);
  if ((iVar3 == -1) ||
     ((ppvVar9 = getInternalBindingAddressPointer
                           ((internal_binding_t **)binding->user_binding->function_handle),
      pvVar8 != (void *)0x0 && (*ppvVar9 != pvVar8)))) {
    if (handle == (void *)0xffffffffffffffff) {
      local_38 = 0;
      local_40 = ___throw_regex_error;
      local_50 = (void *)0x0;
      local_60 = pcVar6;
      dl_iterate_phdr(lib_header_callback,local_48);
      pFVar2 = _stderr;
      if ((int)local_38 == 0) {
        if (debug_level != 0) {
          uVar4 = gotcha_gettid();
          uVar5 = getpid();
          fprintf(pFVar2,"ERROR [%d/%d][%s:%u] - RTLD_NEXT used in code not dynamically loaded",
                  (ulong)uVar4,(ulong)uVar5,"gotcha_dl.c",0x55);
        }
        exit(0x7f);
      }
      lib = local_40;
      pcVar7 = local_60;
      while (pFVar2 = _stderr, lib = lib->l_next, lib != (link_map *)0x0) {
        lVar10 = lookup_exported_symbol(symbol_name,lib,&local_50);
        pFVar2 = _stderr;
        if (lVar10 != -1) {
          uVar11 = (*pcVar7)(lib->l_name,2);
          pvVar8 = (void *)(*local_58)(uVar11,symbol_name);
          return pvVar8;
        }
        if (2 < debug_level) {
          uVar4 = gotcha_gettid();
          uVar5 = getpid();
          pcVar1 = lib->l_name;
          pcVar12 = "[NULL]";
          if ((pcVar1 != (char *)0x0) && (pcVar12 = pcVar1, *pcVar1 == '\0')) {
            pcVar12 = "[EMPTY]";
          }
          fprintf(pFVar2,"[%d/%d][%s:%u] - Symbol %s not found in the library %s\n",(ulong)uVar4,
                  (ulong)uVar5,"gotcha_dl.c",0x62,symbol_name,pcVar12);
          pcVar7 = local_60;
        }
      }
      if (2 < debug_level) {
        uVar4 = gotcha_gettid();
        uVar5 = getpid();
        fprintf(pFVar2,"[%d/%d][%s:%u] - Symbol %s not found in the libraries after caller\n",
                (ulong)uVar4,(ulong)uVar5,"gotcha_dl.c",0x66,symbol_name);
      }
      pvVar8 = (void *)0x0;
    }
  }
  else {
    pvVar8 = binding->user_binding->wrapper_pointer;
  }
  return pvVar8;
}

Assistant:

static void *dlsym_wrapper(void *handle, const char *symbol_name) {
  typeof(&dlopen_wrapper) orig_dlopen = gotcha_get_wrappee(orig_dlopen_handle);
  typeof(&dlsym_wrapper) orig_dlsym = gotcha_get_wrappee(orig_dlsym_handle);
  struct internal_binding_t *binding = NULL;
  debug_printf(1, "User called dlsym(%p, %s)\n", handle, symbol_name);
  int result = lookup_hashtable(&function_hash_table, (hash_key_t)symbol_name,
                                (hash_data_t *)&binding);
  void *val = orig_dlsym(handle, symbol_name);
  if (result != -1) {
    void **wrappee_ptr = getInternalBindingAddressPointer(
        (struct internal_binding_t **)binding->user_binding->function_handle);
    if (val == NULL || *wrappee_ptr == val) {
      // if the wrapper is found and the wrappee is the function requested.
      // This is needed in cases where we wrap a function F1 from library A and
      // we dynamically load function F1 from library B. As name is same, we
      // need to make sure the wrappee are the same as well
      return binding->user_binding->wrapper_pointer;
    }
  }
  if (handle == RTLD_NEXT) {
    struct link_map *lib = gotchas_dlsym_rtld_next_lookup(
        symbol_name, __builtin_return_address(0));
    if (lib) {
      void *handle = orig_dlopen(lib->l_name, RTLD_NOW);
      void *symbol = orig_dlsym(handle, symbol_name);
      return symbol;
    }
    return NULL;
  } else {
    return val;
  }
}